

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockBufferImageGranularity::AllocPages
          (VmaBlockBufferImageGranularity *this,uint8_t allocType,VkDeviceSize offset,
          VkDeviceSize size)

{
  uint16_t uVar1;
  RegionInfo *pRVar2;
  long lVar3;
  uint32_t uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = this->m_BufferImageGranularity;
  if (0x100 < uVar5) {
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar6 = (-uVar5 & offset) >> ((byte)lVar3 & 0x3f);
    pRVar2 = this->m_RegionInfo;
    uVar5 = uVar6 & 0xffffffff;
    if ((pRVar2[uVar5].allocCount == 0) || (pRVar2[uVar5].allocType == '\0')) {
      pRVar2[uVar5].allocType = allocType;
    }
    pRVar2[uVar5].allocCount = pRVar2[uVar5].allocCount + 1;
    uVar4 = GetEndPage(this,offset,size);
    if (uVar4 != (uint32_t)uVar6) {
      pRVar2 = this->m_RegionInfo;
      uVar1 = pRVar2[uVar4].allocCount;
      if ((uVar1 == 0) || (pRVar2[uVar4].allocType == '\0')) {
        pRVar2[uVar4].allocType = allocType;
      }
      pRVar2[uVar4].allocCount = uVar1 + 1;
    }
  }
  return;
}

Assistant:

bool IsEnabled() const { return m_BufferImageGranularity > MAX_LOW_BUFFER_IMAGE_GRANULARITY; }